

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser * init_parse_constants(void)

{
  void *v;
  parser *p_00;
  parser *p;
  angband_constants *z;
  
  v = mem_zalloc(0x100);
  p_00 = parser_new();
  parser_setpriv(p_00,v);
  parser_reg(p_00,"level-max sym label int value",parse_constants_level_max);
  parser_reg(p_00,"mon-gen sym label int value",parse_constants_mon_gen);
  parser_reg(p_00,"mon-play sym label int value",parse_constants_mon_play);
  parser_reg(p_00,"dun-gen sym label int value",parse_constants_dun_gen);
  parser_reg(p_00,"world sym label int value",parse_constants_world);
  parser_reg(p_00,"carry-cap sym label int value",parse_constants_carry_cap);
  parser_reg(p_00,"store sym label int value",parse_constants_store);
  parser_reg(p_00,"obj-make sym label int value",parse_constants_obj_make);
  parser_reg(p_00,"player sym label int value",parse_constants_player);
  parser_reg(p_00,"melee-critical sym label int value",parse_constants_melee_critical);
  parser_reg(p_00,"melee-critical-level uint chance uint dice str msg",
             parse_constants_melee_critical_level);
  parser_reg(p_00,"ranged-critical sym label int value",parse_constants_ranged_critical);
  parser_reg(p_00,"ranged-critical-level uint chance uint dice str msg",
             parse_constants_ranged_critical_level);
  return p_00;
}

Assistant:

static struct parser *init_parse_constants(void) {
	struct angband_constants *z = mem_zalloc(sizeof *z);
	struct parser *p = parser_new();

	parser_setpriv(p, z);
	parser_reg(p, "level-max sym label int value", parse_constants_level_max);
	parser_reg(p, "mon-gen sym label int value", parse_constants_mon_gen);
	parser_reg(p, "mon-play sym label int value", parse_constants_mon_play);
	parser_reg(p, "dun-gen sym label int value", parse_constants_dun_gen);
	parser_reg(p, "world sym label int value", parse_constants_world);
	parser_reg(p, "carry-cap sym label int value", parse_constants_carry_cap);
	parser_reg(p, "store sym label int value", parse_constants_store);
	parser_reg(p, "obj-make sym label int value", parse_constants_obj_make);
	parser_reg(p, "player sym label int value", parse_constants_player);
	parser_reg(p, "melee-critical sym label int value",
		parse_constants_melee_critical);
	parser_reg(p, "melee-critical-level uint chance uint dice str msg",
		parse_constants_melee_critical_level);
	parser_reg(p, "ranged-critical sym label int value",
		parse_constants_ranged_critical);
	parser_reg(p, "ranged-critical-level uint chance uint dice str msg",
		parse_constants_ranged_critical_level);
	return p;
}